

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceLayoutChanged
          (QSortFilterProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QObject *this_00;
  ulong uVar1;
  parameter_type pVar2;
  int iVar3;
  ulong uVar4;
  Data *pDVar5;
  const_iterator begin;
  
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  if (((sourceParents->d).size != 0) && ((this->saved_layoutChange_parents).d.size == 0)) {
    return;
  }
  pDVar5 = (this->source_index_mapping).d;
  if (pDVar5 == (Data *)0x0) {
    pDVar5 = (Data *)0x0;
  }
  else if (pDVar5->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar4 = uVar1;
      if (pDVar5->numBuckets == uVar4) {
        pDVar5 = (Data *)0x0;
        uVar4 = 0;
        break;
      }
      uVar1 = uVar4 + 1;
    } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    goto LAB_00487bc8;
  }
  uVar4 = 0;
LAB_00487bc8:
  begin.i.bucket = uVar4;
  begin.i.d = pDVar5;
  qDeleteAll<QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>::const_iterator>
            (begin,(const_iterator)ZEXT816(0));
  QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::clear
            (&this->source_index_mapping);
  update_persistent_indexes(this,&this->saved_persistent_indexes);
  QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::clear(&this->saved_persistent_indexes);
  pVar2 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
          ::value(&this->dynamic_sortfilter);
  if (pVar2) {
    iVar3 = find_source_sort_column(this);
    this->source_sort_column = iVar3;
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this_00,&this->saved_layoutChange_parents,NoLayoutChangeHint);
  QList<QPersistentModelIndex>::clear(&this->saved_layoutChange_parents);
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceLayoutChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QSortFilterProxyModel);
    Q_UNUSED(hint); // We can't forward Hint because we might filter additional rows or columns

    if (!sourceParents.isEmpty() && saved_layoutChange_parents.isEmpty())
        return;

    // Optimize: We only actually have to clear the mapping related to the contents of
    // sourceParents, not everything.
    qDeleteAll(source_index_mapping);
    source_index_mapping.clear();

    update_persistent_indexes(saved_persistent_indexes);
    saved_persistent_indexes.clear();

    if (dynamic_sortfilter)
        source_sort_column = find_source_sort_column();

    emit q->layoutChanged(saved_layoutChange_parents);
    saved_layoutChange_parents.clear();
}